

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brg_sha1.c
# Opt level: O0

void sha1_compile(sha1_ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint_32t *puVar6;
  uint uVar7;
  uint_32t v4;
  uint_32t v3;
  uint_32t v2;
  uint_32t v1;
  uint_32t v0;
  uint_32t *w;
  sha1_ctx *ctx_local;
  
  puVar6 = ctx->wbuf;
  uVar4 = ctx->hash[0];
  uVar2 = ctx->hash[1];
  uVar5 = ctx->hash[2];
  uVar3 = ctx->hash[3];
  uVar1 = (uVar4 >> 0x1b | uVar4 << 5) + (uVar3 ^ uVar2 & (uVar5 ^ uVar3)) + 0x5a827999 + *puVar6 +
          ctx->hash[4];
  uVar2 = uVar2 >> 2 | uVar2 << 0x1e;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + 0x5a827999 +
          ctx->wbuf[1] + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 << 0x1e;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar2 ^ uVar1 & (uVar4 ^ uVar2)) + 0x5a827999 +
          ctx->wbuf[2] + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + 0x5a827999 +
          ctx->wbuf[3] + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar1 ^ uVar5 & (uVar3 ^ uVar1)) + 0x5a827999 +
          ctx->wbuf[4] + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar3 ^ uVar2 & (uVar5 ^ uVar3)) + 0x5a827999 +
          ctx->wbuf[5] + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + 0x5a827999 +
          ctx->wbuf[6] + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar2 ^ uVar1 & (uVar4 ^ uVar2)) + 0x5a827999 +
          ctx->wbuf[7] + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + 0x5a827999 +
          ctx->wbuf[8] + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar1 ^ uVar5 & (uVar3 ^ uVar1)) + 0x5a827999 +
          ctx->wbuf[9] + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar3 ^ uVar2 & (uVar5 ^ uVar3)) + 0x5a827999 +
          ctx->wbuf[10] + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + 0x5a827999 +
          ctx->wbuf[0xb] + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar2 ^ uVar1 & (uVar4 ^ uVar2)) + 0x5a827999 +
          ctx->wbuf[0xc] + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + 0x5a827999 +
          ctx->wbuf[0xd] + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar1 ^ uVar5 & (uVar3 ^ uVar1)) + 0x5a827999 +
          ctx->wbuf[0xe] + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar3 ^ uVar2 & (uVar5 ^ uVar3)) + 0x5a827999 +
          ctx->wbuf[0xf] + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) << 1 |
          (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) >> 0x1f;
  *puVar6 = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar5 ^ uVar4 & (uVar2 ^ uVar5)) + 0x5a827999 + uVar7 +
          uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) << 1 |
          (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) >> 0x1f;
  ctx->wbuf[1] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar2 ^ uVar1 & (uVar4 ^ uVar2)) + 0x5a827999 + uVar7 +
          uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) << 1 |
          (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) >> 0x1f;
  ctx->wbuf[2] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar4 ^ uVar3 & (uVar1 ^ uVar4)) + 0x5a827999 + uVar7 +
          uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) << 1 |
          (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) >> 0x1f;
  ctx->wbuf[3] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar1 ^ uVar5 & (uVar3 ^ uVar1)) + 0x5a827999 + uVar7 +
          uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) << 1 |
          (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) >> 0x1f;
  ctx->wbuf[4] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) << 1 |
          (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) >> 0x1f;
  ctx->wbuf[5] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) << 1 |
          (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) >> 0x1f;
  ctx->wbuf[6] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) << 1 |
          (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) >> 0x1f;
  ctx->wbuf[7] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) << 1 |
          (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) >> 0x1f;
  ctx->wbuf[8] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) << 1 |
          (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) >> 0x1f;
  ctx->wbuf[9] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) << 1 |
          (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) >> 0x1f;
  ctx->wbuf[10] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) << 1 |
          (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) >> 0x1f;
  ctx->wbuf[0xb] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) << 1 |
          (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) >> 0x1f;
  ctx->wbuf[0xc] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) << 1 |
          (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) >> 0x1f;
  ctx->wbuf[0xd] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) << 1 |
          (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) >> 0x1f;
  ctx->wbuf[0xe] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) << 1 |
          (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) >> 0x1f;
  ctx->wbuf[0xf] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) << 1 |
          (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) >> 0x1f;
  *puVar6 = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) << 1 |
          (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) >> 0x1f;
  ctx->wbuf[1] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) << 1 |
          (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) >> 0x1f;
  ctx->wbuf[2] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) << 1 |
          (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) >> 0x1f;
  ctx->wbuf[3] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + 0x6ed9eba1 + uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) << 1 |
          (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) >> 0x1f;
  ctx->wbuf[4] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar2 ^ uVar5) + 0x6ed9eba1 + uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) << 1 |
          (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) >> 0x1f;
  ctx->wbuf[5] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar2) + 0x6ed9eba1 + uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) << 1 |
          (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) >> 0x1f;
  ctx->wbuf[6] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar1 ^ uVar4) + 0x6ed9eba1 + uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) << 1 |
          (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) >> 0x1f;
  ctx->wbuf[7] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 ^ uVar3 ^ uVar1) + 0x6ed9eba1 + uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) << 1 |
          (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) >> 0x1f;
  ctx->wbuf[8] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 & uVar5 | uVar3 & (uVar2 ^ uVar5)) + -0x70e44324 +
          uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) << 1 |
          (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) >> 0x1f;
  ctx->wbuf[9] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 & uVar2 | uVar5 & (uVar4 ^ uVar2)) + -0x70e44324 +
          uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) << 1 |
          (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) >> 0x1f;
  ctx->wbuf[10] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 & uVar4 | uVar2 & (uVar1 ^ uVar4)) + -0x70e44324 +
          uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) << 1 |
          (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) >> 0x1f;
  ctx->wbuf[0xb] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 & uVar1 | uVar4 & (uVar3 ^ uVar1)) + -0x70e44324 +
          uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) << 1 |
          (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) >> 0x1f;
  ctx->wbuf[0xc] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 & uVar3 | uVar1 & (uVar5 ^ uVar3)) + -0x70e44324 +
          uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) << 1 |
          (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) >> 0x1f;
  ctx->wbuf[0xd] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 & uVar5 | uVar3 & (uVar2 ^ uVar5)) + -0x70e44324 +
          uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) << 1 |
          (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) >> 0x1f;
  ctx->wbuf[0xe] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 & uVar2 | uVar5 & (uVar4 ^ uVar2)) + -0x70e44324 +
          uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) << 1 |
          (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) >> 0x1f;
  ctx->wbuf[0xf] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 & uVar4 | uVar2 & (uVar1 ^ uVar4)) + -0x70e44324 +
          uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) << 1 |
          (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) >> 0x1f;
  *puVar6 = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 & uVar1 | uVar4 & (uVar3 ^ uVar1)) + -0x70e44324 +
          uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) << 1 |
          (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) >> 0x1f;
  ctx->wbuf[1] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 & uVar3 | uVar1 & (uVar5 ^ uVar3)) + -0x70e44324 +
          uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) << 1 |
          (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) >> 0x1f;
  ctx->wbuf[2] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 & uVar5 | uVar3 & (uVar2 ^ uVar5)) + -0x70e44324 +
          uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) << 1 |
          (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) >> 0x1f;
  ctx->wbuf[3] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 & uVar2 | uVar5 & (uVar4 ^ uVar2)) + -0x70e44324 +
          uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) << 1 |
          (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) >> 0x1f;
  ctx->wbuf[4] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 & uVar4 | uVar2 & (uVar1 ^ uVar4)) + -0x70e44324 +
          uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) << 1 |
          (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) >> 0x1f;
  ctx->wbuf[5] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 & uVar1 | uVar4 & (uVar3 ^ uVar1)) + -0x70e44324 +
          uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) << 1 |
          (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) >> 0x1f;
  ctx->wbuf[6] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 & uVar3 | uVar1 & (uVar5 ^ uVar3)) + -0x70e44324 +
          uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) << 1 |
          (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) >> 0x1f;
  ctx->wbuf[7] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 & uVar5 | uVar3 & (uVar2 ^ uVar5)) + -0x70e44324 +
          uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) << 1 |
          (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) >> 0x1f;
  ctx->wbuf[8] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 & uVar2 | uVar5 & (uVar4 ^ uVar2)) + -0x70e44324 +
          uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) << 1 |
          (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) >> 0x1f;
  ctx->wbuf[9] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 & uVar4 | uVar2 & (uVar1 ^ uVar4)) + -0x70e44324 +
          uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) << 1 |
          (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) >> 0x1f;
  ctx->wbuf[10] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 & uVar1 | uVar4 & (uVar3 ^ uVar1)) + -0x70e44324 +
          uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) << 1 |
          (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) >> 0x1f;
  ctx->wbuf[0xb] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 & uVar3 | uVar1 & (uVar5 ^ uVar3)) + -0x70e44324 +
          uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) << 1 |
          (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) >> 0x1f;
  ctx->wbuf[0xc] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) << 1 |
          (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) >> 0x1f;
  ctx->wbuf[0xd] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar2 ^ uVar5) + -0x359d3e2a + uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) << 1 |
          (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) >> 0x1f;
  ctx->wbuf[0xe] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar2) + -0x359d3e2a + uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) << 1 |
          (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) >> 0x1f;
  ctx->wbuf[0xf] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar1 ^ uVar4) + -0x359d3e2a + uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) << 1 |
          (ctx->wbuf[0xd] ^ ctx->wbuf[8] ^ ctx->wbuf[2] ^ *puVar6) >> 0x1f;
  *puVar6 = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 ^ uVar3 ^ uVar1) + -0x359d3e2a + uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) << 1 |
          (ctx->wbuf[0xe] ^ ctx->wbuf[9] ^ ctx->wbuf[3] ^ ctx->wbuf[1]) >> 0x1f;
  ctx->wbuf[1] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) << 1 |
          (ctx->wbuf[0xf] ^ ctx->wbuf[10] ^ ctx->wbuf[4] ^ ctx->wbuf[2]) >> 0x1f;
  ctx->wbuf[2] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar2 ^ uVar5) + -0x359d3e2a + uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) << 1 |
          (*puVar6 ^ ctx->wbuf[0xb] ^ ctx->wbuf[5] ^ ctx->wbuf[3]) >> 0x1f;
  ctx->wbuf[3] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar2) + -0x359d3e2a + uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) << 1 |
          (ctx->wbuf[1] ^ ctx->wbuf[0xc] ^ ctx->wbuf[6] ^ ctx->wbuf[4]) >> 0x1f;
  ctx->wbuf[4] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar1 ^ uVar4) + -0x359d3e2a + uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) << 1 |
          (ctx->wbuf[2] ^ ctx->wbuf[0xd] ^ ctx->wbuf[7] ^ ctx->wbuf[5]) >> 0x1f;
  ctx->wbuf[5] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 ^ uVar3 ^ uVar1) + -0x359d3e2a + uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) << 1 |
          (ctx->wbuf[3] ^ ctx->wbuf[0xe] ^ ctx->wbuf[8] ^ ctx->wbuf[6]) >> 0x1f;
  ctx->wbuf[6] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar7 + uVar1;
  uVar2 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar7 = (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) << 1 |
          (ctx->wbuf[4] ^ ctx->wbuf[0xf] ^ ctx->wbuf[9] ^ ctx->wbuf[7]) >> 0x1f;
  ctx->wbuf[7] = uVar7;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar2 ^ uVar5) + -0x359d3e2a + uVar7 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar7 = (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) << 1 |
          (ctx->wbuf[5] ^ *puVar6 ^ ctx->wbuf[10] ^ ctx->wbuf[8]) >> 0x1f;
  ctx->wbuf[8] = uVar7;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar2) + -0x359d3e2a + uVar7 + uVar5;
  uVar1 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar7 = (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) << 1 |
          (ctx->wbuf[6] ^ ctx->wbuf[1] ^ ctx->wbuf[0xb] ^ ctx->wbuf[9]) >> 0x1f;
  ctx->wbuf[9] = uVar7;
  uVar2 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar1 ^ uVar4) + -0x359d3e2a + uVar7 + uVar2;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar7 = (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) << 1 |
          (ctx->wbuf[7] ^ ctx->wbuf[2] ^ ctx->wbuf[0xc] ^ ctx->wbuf[10]) >> 0x1f;
  ctx->wbuf[10] = uVar7;
  uVar4 = (uVar2 >> 0x1b | uVar2 * 0x20) + (uVar5 ^ uVar3 ^ uVar1) + -0x359d3e2a + uVar7 + uVar4;
  uVar5 = uVar5 >> 2 | uVar5 * 0x40000000;
  uVar7 = (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) << 1 |
          (ctx->wbuf[8] ^ ctx->wbuf[3] ^ ctx->wbuf[0xd] ^ ctx->wbuf[0xb]) >> 0x1f;
  ctx->wbuf[0xb] = uVar7;
  uVar1 = (uVar4 >> 0x1b | uVar4 * 0x20) + (uVar2 ^ uVar5 ^ uVar3) + -0x359d3e2a + uVar7 + uVar1;
  uVar7 = uVar2 >> 2 | uVar2 * 0x40000000;
  uVar2 = (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) << 1 |
          (ctx->wbuf[9] ^ ctx->wbuf[4] ^ ctx->wbuf[0xe] ^ ctx->wbuf[0xc]) >> 0x1f;
  ctx->wbuf[0xc] = uVar2;
  uVar3 = (uVar1 >> 0x1b | uVar1 * 0x20) + (uVar4 ^ uVar7 ^ uVar5) + -0x359d3e2a + uVar2 + uVar3;
  uVar4 = uVar4 >> 2 | uVar4 * 0x40000000;
  uVar2 = (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) << 1 |
          (ctx->wbuf[10] ^ ctx->wbuf[5] ^ ctx->wbuf[0xf] ^ ctx->wbuf[0xd]) >> 0x1f;
  ctx->wbuf[0xd] = uVar2;
  uVar5 = (uVar3 >> 0x1b | uVar3 * 0x20) + (uVar1 ^ uVar4 ^ uVar7) + -0x359d3e2a + uVar2 + uVar5;
  uVar2 = uVar1 >> 2 | uVar1 * 0x40000000;
  uVar1 = (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) << 1 |
          (ctx->wbuf[0xb] ^ ctx->wbuf[6] ^ *puVar6 ^ ctx->wbuf[0xe]) >> 0x1f;
  ctx->wbuf[0xe] = uVar1;
  uVar7 = (uVar5 >> 0x1b | uVar5 * 0x20) + (uVar3 ^ uVar2 ^ uVar4) + -0x359d3e2a + uVar1 + uVar7;
  uVar3 = uVar3 >> 2 | uVar3 * 0x40000000;
  uVar1 = (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) << 1 |
          (ctx->wbuf[0xc] ^ ctx->wbuf[7] ^ ctx->wbuf[1] ^ ctx->wbuf[0xf]) >> 0x1f;
  ctx->wbuf[0xf] = uVar1;
  ctx->hash[0] = (uVar7 >> 0x1b | uVar7 * 0x20) + (uVar5 ^ uVar3 ^ uVar2) + -0x359d3e2a + uVar1 +
                 uVar4 + ctx->hash[0];
  ctx->hash[1] = uVar7 + ctx->hash[1];
  ctx->hash[2] = (uVar5 >> 2 | uVar5 * 0x40000000) + ctx->hash[2];
  ctx->hash[3] = uVar3 + ctx->hash[3];
  ctx->hash[4] = uVar2 + ctx->hash[4];
  return;
}

Assistant:

VOID_RETURN sha1_compile(sha1_ctx ctx[1])
{   uint_32t    *w = ctx->wbuf;

#ifdef ARRAY
    uint_32t    v[5];
    memcpy(v, ctx->hash, 5 * sizeof(uint_32t));
#else
    uint_32t    v0, v1, v2, v3, v4;
    v0 = ctx->hash[0]; v1 = ctx->hash[1];
    v2 = ctx->hash[2]; v3 = ctx->hash[3];
    v4 = ctx->hash[4];
#endif

#define hf(i)   w[i]

    five_cycle(v, ch, 0x5a827999,  0);
    five_cycle(v, ch, 0x5a827999,  5);
    five_cycle(v, ch, 0x5a827999, 10);
    one_cycle(v,0,1,2,3,4, ch, 0x5a827999, hf(15)); \

#undef  hf
#define hf(i) (w[(i) & 15] = rotl32(                    \
                 w[((i) + 13) & 15] ^ w[((i) + 8) & 15] \
               ^ w[((i) +  2) & 15] ^ w[(i) & 15], 1))

    one_cycle(v,4,0,1,2,3, ch, 0x5a827999, hf(16));
    one_cycle(v,3,4,0,1,2, ch, 0x5a827999, hf(17));
    one_cycle(v,2,3,4,0,1, ch, 0x5a827999, hf(18));
    one_cycle(v,1,2,3,4,0, ch, 0x5a827999, hf(19));

    five_cycle(v, parity, 0x6ed9eba1,  20);
    five_cycle(v, parity, 0x6ed9eba1,  25);
    five_cycle(v, parity, 0x6ed9eba1,  30);
    five_cycle(v, parity, 0x6ed9eba1,  35);

    five_cycle(v, maj, 0x8f1bbcdc,  40);
    five_cycle(v, maj, 0x8f1bbcdc,  45);
    five_cycle(v, maj, 0x8f1bbcdc,  50);
    five_cycle(v, maj, 0x8f1bbcdc,  55);

    five_cycle(v, parity, 0xca62c1d6,  60);
    five_cycle(v, parity, 0xca62c1d6,  65);
    five_cycle(v, parity, 0xca62c1d6,  70);
    five_cycle(v, parity, 0xca62c1d6,  75);

#ifdef ARRAY
    ctx->hash[0] += v[0]; ctx->hash[1] += v[1];
    ctx->hash[2] += v[2]; ctx->hash[3] += v[3];
    ctx->hash[4] += v[4];
#else
    ctx->hash[0] += v0; ctx->hash[1] += v1;
    ctx->hash[2] += v2; ctx->hash[3] += v3;
    ctx->hash[4] += v4;
#endif
}